

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool operator>(BigNum *a,BigNum *b)

{
  int iVar1;
  code *pcVar2;
  reference pvVar3;
  int local_24;
  int i;
  BigNum *b_local;
  BigNum *a_local;
  
  if ((a->sign & 1U) == (b->sign & 1U)) {
    if ((a->sign & 1U) == 0) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (b->length < a->length) {
      a_local._7_1_ = true;
    }
    else if (a->length < b->length) {
      a_local._7_1_ = false;
    }
    else {
      local_24 = a->length;
      do {
        local_24 = local_24 + -1;
        if (local_24 < 0) {
          return false;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&a->digits,(long)local_24);
        iVar1 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&b->digits,(long)local_24);
        if (*pvVar3 < iVar1) {
          return true;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&a->digits,(long)local_24);
        iVar1 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&b->digits,(long)local_24);
      } while (*pvVar3 <= iVar1);
      a_local._7_1_ = false;
    }
  }
  else if ((a->sign & 1U) == 0) {
    a_local._7_1_ = false;
  }
  else {
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

bool operator >(BigNum a, BigNum b){
    if (a.sign != b.sign){
        if (a.sign)
            return true;
        else
            return false;
    }
    else {
        if (a.sign){
            if (a.length > b.length)
                return true;
            else if (b.length > a.length)
                return false;
            else {
                for (int i = a.length - 1; i >= 0; i--){
                    if (a.digits[i] > b.digits[i])
                        return true;
                    else if (a.digits[i] < b.digits[i])
                        return  false;
                }
                return false;
            }
        }
    }
}